

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,false,false>
               (uchar *ldata,uchar *rdata,uchar *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ValidityMask *pVVar6;
  byte bVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ulong uVar10;
  idx_t idx_in_entry;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uchar *puVar14;
  uchar *puVar15;
  uchar *puVar16;
  ulong uVar17;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  uchar *local_98;
  _Head_base<0UL,_unsigned_long_*,_false> local_90;
  ValidityMask *local_88;
  uchar *local_80;
  uchar *local_78;
  ulong local_70;
  buffer_ptr<ValidityBuffer> *local_68;
  idx_t local_60;
  uchar *local_58;
  uchar *local_50;
  uchar *local_48;
  ulong local_40;
  ulong local_38;
  
  _Var9._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_80 = ldata;
  local_78 = rdata;
  if (_Var9._M_head_impl == (unsigned_long *)0x0) {
    if (count != 0) {
      _Var9._M_head_impl = (unsigned_long *)0x0;
      uVar11 = 0;
      do {
        bVar7 = ldata[uVar11];
        if (rdata[uVar11] == 0) {
          if (_Var9._M_head_impl == (unsigned_long *)0x0) {
            local_90._M_head_impl =
                 (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,(unsigned_long *)&local_90);
            p_Var5 = p_Stack_a0;
            peVar4 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar4;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var5;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var9._M_head_impl =
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var9._M_head_impl;
            rdata = local_78;
            ldata = local_80;
          }
          bVar3 = (byte)uVar11 & 0x3f;
          _Var9._M_head_impl[uVar11 >> 6] =
               _Var9._M_head_impl[uVar11 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        else {
          bVar7 = bVar7 / rdata[uVar11];
        }
        result_data[uVar11] = bVar7;
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_70 = count + 0x3f >> 6;
    local_68 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_38 = 0;
    uVar11 = 0;
    local_98 = result_data;
    local_88 = mask;
    local_60 = count;
    do {
      if (_Var9._M_head_impl == (unsigned_long *)0x0) {
        uVar17 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar17 = count;
        }
LAB_01497ef8:
        uVar12 = uVar11;
        if (uVar11 < uVar17) {
          do {
            bVar7 = ldata[uVar11];
            if (rdata[uVar11] == 0) {
              if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                local_90._M_head_impl =
                     (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_a8,(unsigned_long *)&local_90);
                p_Var5 = p_Stack_a0;
                peVar4 = local_a8;
                local_a8 = (element_type *)0x0;
                p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar4;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var5;
                if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                   p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_68);
                _Var9._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var9._M_head_impl;
                rdata = local_78;
                ldata = local_80;
              }
              bVar3 = (byte)uVar11 & 0x3f;
              _Var9._M_head_impl[uVar11 >> 6] =
                   _Var9._M_head_impl[uVar11 >> 6] &
                   (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
            }
            else {
              bVar7 = bVar7 / rdata[uVar11];
            }
            result_data[uVar11] = bVar7;
            uVar11 = uVar11 + 1;
            uVar12 = uVar17;
          } while (uVar17 != uVar11);
        }
      }
      else {
        uVar1 = _Var9._M_head_impl[local_38];
        uVar17 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar17 = count;
        }
        uVar12 = uVar17;
        result_data = local_98;
        if (uVar1 != 0) {
          if (uVar1 == 0xffffffffffffffff) goto LAB_01497ef8;
          uVar13 = uVar17 - uVar11;
          uVar12 = uVar11;
          if (uVar11 <= uVar17 && uVar13 != 0) {
            puVar14 = local_98 + uVar11;
            puVar15 = rdata + uVar11;
            puVar16 = ldata + uVar11;
            uVar10 = 0;
            local_58 = puVar16;
            local_50 = puVar15;
            local_48 = puVar14;
            local_40 = uVar13;
            do {
              pVVar6 = local_88;
              if ((uVar1 >> (uVar10 & 0x3f) & 1) != 0) {
                bVar7 = puVar16[uVar10];
                if (puVar15[uVar10] == 0) {
                  if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                    local_90._M_head_impl =
                         (unsigned_long *)
                         (local_88->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_a8,(unsigned_long *)&local_90);
                    p_Var5 = p_Stack_a0;
                    peVar4 = local_a8;
                    local_a8 = (element_type *)0x0;
                    p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var2 = (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar4;
                    (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var5;
                    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                       p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                    }
                    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_68);
                    _Var9._M_head_impl =
                         (pTVar8->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (local_88->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var9._M_head_impl;
                    rdata = local_78;
                    ldata = local_80;
                    uVar13 = local_40;
                    puVar14 = local_48;
                    puVar15 = local_50;
                    puVar16 = local_58;
                    count = local_60;
                  }
                  bVar3 = (byte)(uVar10 + uVar11) & 0x3f;
                  _Var9._M_head_impl[uVar10 + uVar11 >> 6] =
                       _Var9._M_head_impl[uVar10 + uVar11 >> 6] &
                       (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
                }
                else {
                  bVar7 = bVar7 / puVar15[uVar10];
                }
                puVar14[uVar10] = bVar7;
              }
              uVar10 = uVar10 + 1;
              mask = local_88;
              uVar12 = uVar17;
              result_data = local_98;
            } while (uVar13 != uVar10);
          }
        }
      }
      local_38 = local_38 + 1;
      uVar11 = uVar12;
    } while (local_38 != local_70);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}